

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_CCtx_refCDict(ZSTD_CCtx *cctx,ZSTD_CDict *cdict)

{
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_clearAllDicts(cctx);
  cctx->cdict = cdict;
  return 0;
}

Assistant:

size_t ZSTD_CCtx_refCDict(ZSTD_CCtx* cctx, const ZSTD_CDict* cdict)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't ref a dict when ctx not in init stage.");
    /* Free the existing local cdict (if any) to save memory. */
    ZSTD_clearAllDicts(cctx);
    cctx->cdict = cdict;
    return 0;
}